

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ShowExampleAppFullscreen(bool *p_open)

{
  bool bVar1;
  undefined1 *in_RDI;
  ImGuiViewport *viewport;
  bool *in_stack_000000f0;
  char *in_stack_000000f8;
  ImGuiWindowFlags in_stack_000003c4;
  bool *in_stack_000003c8;
  char *in_stack_000003d0;
  ImVec2 *in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  uint uVar2;
  ImVec2 *local_38;
  float indent_w;
  ImVec2 *local_28;
  ImVec2 local_20;
  ImVec2 local_18;
  ImGuiViewport *local_10;
  undefined1 *local_8;
  
  local_8 = in_RDI;
  local_10 = ImGui::GetMainViewport();
  if ((ShowExampleAppFullscreen::use_work_area & 1U) == 0) {
    local_28 = &local_10->Pos;
  }
  else {
    local_28 = &local_10->WorkPos;
  }
  ImVec2::ImVec2(&local_18,0.0,0.0);
  ImGui::SetNextWindowPos(local_28,0,&local_18);
  indent_w = (float)((ulong)local_28 >> 0x20);
  if ((ShowExampleAppFullscreen::use_work_area & 1U) == 0) {
    local_38 = &local_10->Size;
  }
  else {
    local_38 = &local_10->WorkSize;
  }
  ImGui::SetNextWindowSize(local_38,0);
  bVar1 = ImGui::Begin(in_stack_000003d0,in_stack_000003c8,in_stack_000003c4);
  if (bVar1) {
    ImGui::Checkbox(in_stack_000000f8,in_stack_000000f0);
    ImGui::SameLine(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
    HelpMarker((char *)0x168527);
    ImGui::CheckboxFlags
              ((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (int *)in_stack_ffffffffffffffb8,0);
    ImGui::CheckboxFlags
              ((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (int *)in_stack_ffffffffffffffb8,0);
    ImGui::Indent(indent_w);
    ImGui::CheckboxFlags
              ((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (int *)in_stack_ffffffffffffffb8,0);
    ImGui::CheckboxFlags
              ((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (int *)in_stack_ffffffffffffffb8,0);
    ImGui::CheckboxFlags
              ((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (int *)in_stack_ffffffffffffffb8,0);
    ImGui::Unindent(indent_w);
    uVar2 = (uint)in_stack_ffffffffffffffc4 & 0xffffff;
    if (local_8 != (undefined1 *)0x0) {
      ImVec2::ImVec2(&local_20,0.0,0.0);
      bVar1 = ImGui::Button((char *)CONCAT44(uVar2,in_stack_ffffffffffffffc0),
                            in_stack_ffffffffffffffb8);
      uVar2 = (uint)bVar1 << 0x18;
    }
    if ((char)(uVar2 >> 0x18) != '\0') {
      *local_8 = 0;
    }
  }
  ImGui::End();
  return;
}

Assistant:

static void ShowExampleAppFullscreen(bool* p_open)
{
    static bool use_work_area = true;
    static ImGuiWindowFlags flags = ImGuiWindowFlags_NoDecoration | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoSavedSettings;

    // We demonstrate using the full viewport area or the work area (without menu-bars, task-bars etc.)
    // Based on your use case you may want one of the other.
    const ImGuiViewport* viewport = ImGui::GetMainViewport();
    ImGui::SetNextWindowPos(use_work_area ? viewport->WorkPos : viewport->Pos);
    ImGui::SetNextWindowSize(use_work_area ? viewport->WorkSize : viewport->Size);

    if (ImGui::Begin("Example: Fullscreen window", p_open, flags))
    {
        ImGui::Checkbox("Use work area instead of main area", &use_work_area);
        ImGui::SameLine();
        HelpMarker("Main Area = entire viewport,\nWork Area = entire viewport minus sections used by the main menu bars, task bars etc.\n\nEnable the main-menu bar in Examples menu to see the difference.");

        ImGui::CheckboxFlags("ImGuiWindowFlags_NoBackground", &flags, ImGuiWindowFlags_NoBackground);
        ImGui::CheckboxFlags("ImGuiWindowFlags_NoDecoration", &flags, ImGuiWindowFlags_NoDecoration);
        ImGui::Indent();
        ImGui::CheckboxFlags("ImGuiWindowFlags_NoTitleBar", &flags, ImGuiWindowFlags_NoTitleBar);
        ImGui::CheckboxFlags("ImGuiWindowFlags_NoCollapse", &flags, ImGuiWindowFlags_NoCollapse);
        ImGui::CheckboxFlags("ImGuiWindowFlags_NoScrollbar", &flags, ImGuiWindowFlags_NoScrollbar);
        ImGui::Unindent();

        if (p_open && ImGui::Button("Close this window"))
            *p_open = false;
    }
    ImGui::End();
}